

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsTest.cpp
# Opt level: O0

void Generate(mt19937 *rng,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  uint *this;
  result_type rVar1;
  result_type_conflict1 rVar2;
  value_type_conflict1 local_41;
  uint local_40;
  uint32_t i;
  uniform_int_distribution<unsigned_int> ud;
  uint32_t size;
  result_type_conflict1 rndVal;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  mt19937 *rng_local;
  
  this = &ud._M_param._M_b;
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)this,0.0,1.0);
  rVar2 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)this,rng);
  ud._M_param._M_a = (int)(long)(rVar2 * rVar2 * rVar2 * 4194303.0) + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(buffer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (buffer,(ulong)ud._M_param._M_a);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&stack0xffffffffffffffc4,0,0xff);
  for (local_40 = 0; local_40 < ud._M_param._M_a; local_40 = local_40 + 1) {
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&stack0xffffffffffffffc4,rng);
    local_41 = (value_type_conflict1)rVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(buffer,&local_41);
  }
  return;
}

Assistant:

static void Generate(std::mt19937 & rng, std::vector<uint8_t> & buffer)
{
	// Fill up a test buffer of random size with random data. 
	auto rndVal = std::uniform_real_distribution<double>(0.0, 1.0f)(rng);
	auto size = static_cast<uint32_t>((rndVal * rndVal * rndVal) * (MAX_PAYLOAD_SIZE - MIN_PAYLOAD_SIZE)) + MIN_PAYLOAD_SIZE;
	buffer.clear();
	buffer.reserve(size);
	auto ud = std::uniform_int_distribution<uint32_t>(0, 255);
	for (uint32_t i = 0; i < size; ++i)
		buffer.push_back(static_cast<uint8_t>(ud(rng)));
}